

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zfio.c
# Opt level: O0

int zfpeek(zfp *zf)

{
  byte *pbVar1;
  uint local_18;
  uint local_14;
  int c;
  zfp *zf_local;
  
  if (zf->fp == (FILE *)0x0) {
    if (zf->gz->have == 0) {
      local_18 = gzgetc(zf->gz);
    }
    else {
      zf->gz->have = zf->gz->have - 1;
      zf->gz->pos = zf->gz->pos + 1;
      pbVar1 = zf->gz->next;
      zf->gz->next = pbVar1 + 1;
      local_18 = (uint)*pbVar1;
    }
    local_14 = local_18;
    if (local_18 != 0xffffffff) {
      gzungetc(local_18,zf->gz);
    }
  }
  else {
    local_14 = getc((FILE *)zf->fp);
    if (local_14 != 0xffffffff) {
      ungetc(local_14,(FILE *)zf->fp);
    }
  }
  return local_14;
}

Assistant:

int zfpeek(zfp *zf) {
    int c;

    if (zf->fp) {
	c = getc(zf->fp);
	if (c != EOF)
	    ungetc(c, zf->fp);
    } else {
	c = gzgetc(zf->gz);
	if (c != EOF)
	    gzungetc(c, zf->gz);
    }

    return c;
}